

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O2

void __thiscall
CStringKMerFactory128::create_kmers_direction
          (CStringKMerFactory128 *this,
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          *mers,char *s)

{
  __uint128_t *rkmer;
  __uint128_t *fkmer;
  ulong *puVar1;
  ulong uVar2;
  ulong in_RAX;
  bool *__args_1;
  __uint128_t *__args;
  undefined8 uStack_38;
  
  rkmer = &(this->super_KMerFactory128).fkmer;
  fkmer = &(this->super_KMerFactory128).rkmer;
  *(undefined8 *)((long)&(this->super_KMerFactory128).rkmer + 8) = 0;
  *(undefined8 *)((long)&(this->super_KMerFactory128).fkmer + 8) = 0;
  *(undefined8 *)&(this->super_KMerFactory128).rkmer = 0;
  (this->super_KMerFactory128).last_unknown = 0;
  *(undefined8 *)&(this->super_KMerFactory128).fkmer = 0;
  uStack_38 = in_RAX;
  for (; *s != '\0'; s = (char *)((uchar *)s + 1)) {
    KMerFactory128::fillKBuf
              (&this->super_KMerFactory128,*s,rkmer,fkmer,&(this->super_KMerFactory128).last_unknown
              );
    if ((long)(ulong)(this->super_KMerFactory128).K <= (this->super_KMerFactory128).last_unknown) {
      uVar2 = *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8);
      puVar1 = (ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
      if (uVar2 < *puVar1 || uVar2 - *puVar1 < (ulong)((ulong)*fkmer < (ulong)*rkmer)) {
        uStack_38._0_7_ = CONCAT16(1,(undefined6)uStack_38);
        __args_1 = (bool *)((long)&uStack_38 + 6);
        __args = fkmer;
      }
      else {
        uStack_38 = uStack_38 & 0xffffffffffffff;
        __args_1 = (bool *)((long)&uStack_38 + 7);
        __args = rkmer;
      }
      std::vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>
      ::emplace_back<unsigned__int128&,bool>
                ((vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>
                  *)mers,__args,__args_1);
    }
  }
  return;
}

Assistant:

const void create_kmers_direction(std::vector<std::pair<__uint128_t,bool>> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer,false);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer,true);
                }
            }
        }
    }